

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O1

void test_shift_right(void)

{
  uint64_t *puVar1;
  bool bVar2;
  _Bool _Var3;
  bitset_t *pbVar4;
  size_t sVar5;
  size_t sVar6;
  bitset_t *pbVar7;
  size_t sVar8;
  long lVar9;
  bitset_t *pbVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint64_t uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong auStack_160 [4];
  bitset_t *pbStack_140;
  bitset_t *pbStack_138;
  code *pcStack_130;
  bitset_t *pbStack_120;
  undefined8 uStack_118;
  bitset_t *pbStack_110;
  code *pcStack_108;
  bitset_t *pbStack_f8;
  bitset_t *pbStack_f0;
  bitset_t *pbStack_e8;
  ulong uStack_e0;
  ulong uStack_d8;
  bitset_t *pbStack_d0;
  code *pcStack_c8;
  bitset_t *pbStack_c0;
  long lStack_b8;
  ulong uStack_b0;
  bitset_t *pbStack_a8;
  code *pcStack_a0;
  bitset_t *pbStack_90;
  ulong uStack_88;
  ulong uStack_80;
  bitset_t *pbStack_78;
  long lStack_70;
  code *pcStack_68;
  size_t sStack_60;
  long lStack_58;
  long lStack_50;
  bitset_t *pbStack_48;
  code *pcStack_40;
  size_t local_38;
  
  lVar16 = 0;
  lVar17 = 0;
  local_38 = 0;
  do {
    lVar11 = 300;
    pcStack_40 = (code *)0x101dca;
    pbVar4 = bitset_create();
    do {
      uVar21 = (ulong)(lVar17 + lVar11) >> 6;
      if (uVar21 < pbVar4->arraysize) {
LAB_00101df0:
        pbVar4->array[uVar21] = pbVar4->array[uVar21] | 1L << ((byte)(lVar17 + lVar11) & 0x3f);
      }
      else {
        pcStack_40 = (code *)0x101dec;
        _Var3 = bitset_grow(pbVar4,uVar21 + 1);
        if (_Var3) goto LAB_00101df0;
      }
      lVar11 = lVar11 + 3;
    } while (lVar11 != 0x3bc4);
    pcStack_40 = (code *)0x101e16;
    sVar5 = bitset_count(pbVar4);
    sVar8 = local_38;
    pcStack_40 = (code *)0x101e28;
    bitset_shift_right(pbVar4,local_38);
    pcStack_40 = (code *)0x101e30;
    sVar6 = bitset_count(pbVar4);
    if (sVar6 != sVar5) {
LAB_00101e9c:
      pcStack_40 = test_union_intersection;
      test_shift_right_cold_1();
      sStack_60 = sVar8;
      pcStack_68 = (code *)0x101eaf;
      lStack_58 = lVar16;
      lStack_50 = lVar17;
      pbStack_48 = pbVar4;
      pcStack_40 = (code *)sVar5;
      pbVar4 = bitset_create();
      lVar16 = 0;
      pcStack_68 = (code *)0x101eba;
      pbVar7 = bitset_create();
      uVar21 = 0;
      break;
    }
    lVar9 = 300;
    do {
      uVar21 = (ulong)(lVar16 + lVar9) >> 6;
      if ((pbVar4->arraysize <= uVar21) ||
         ((pbVar4->array[uVar21] >> (lVar16 + lVar9 & 0x3fU) & 1) == 0)) {
        pcStack_40 = (code *)0x101e9c;
        test_shift_right_cold_2();
        goto LAB_00101e9c;
      }
      lVar9 = lVar9 + 3;
    } while (lVar9 != 0x3bc4);
    pcStack_40 = (code *)0x101e70;
    bitset_free(pbVar4);
    local_38 = sVar8 + 1;
    lVar17 = lVar17 + 3;
    lVar16 = lVar16 + 2;
    if (local_38 == 0x100) {
      return;
    }
  } while( true );
  while( true ) {
    uVar21 = uVar21 + 1;
    lVar16 = lVar16 + 2;
    if (uVar21 == 1000) break;
    uVar18 = uVar21 >> 5;
    if (uVar18 < pbVar4->arraysize) {
LAB_00101edd:
      pbVar4->array[uVar18] = pbVar4->array[uVar18] | 1L << ((byte)lVar16 & 0x3e);
    }
    else {
      pcStack_68 = (code *)0x101ed9;
      _Var3 = bitset_grow(pbVar4,uVar18 + 1);
      if (_Var3) goto LAB_00101edd;
    }
    if (uVar18 < pbVar7->arraysize) {
LAB_00101f08:
      pbVar7->array[uVar18] = pbVar7->array[uVar18] | 2L << ((byte)lVar16 & 0x3e);
    }
    else {
      pcStack_68 = (code *)0x101f04;
      _Var3 = bitset_grow(pbVar7,uVar18 + 1);
      if (_Var3) goto LAB_00101f08;
    }
  }
  pcStack_68 = (code *)0x101f38;
  bitset_inplace_symmetric_difference(pbVar4,pbVar7);
  pcStack_68 = (code *)0x101f40;
  sVar8 = bitset_count(pbVar4);
  if (sVar8 == 2000) {
    pcStack_68 = (code *)0x101f57;
    bitset_inplace_symmetric_difference(pbVar4,pbVar7);
    pcStack_68 = (code *)0x101f5f;
    sVar8 = bitset_count(pbVar4);
    if (sVar8 != 1000) goto LAB_00102019;
    pcStack_68 = (code *)0x101f76;
    bitset_inplace_difference(pbVar4,pbVar7);
    pcStack_68 = (code *)0x101f7e;
    sVar8 = bitset_count(pbVar4);
    if (sVar8 != 1000) goto LAB_0010201e;
    pcStack_68 = (code *)0x101f95;
    bitset_inplace_union(pbVar4,pbVar7);
    pcStack_68 = (code *)0x101f9d;
    sVar8 = bitset_count(pbVar4);
    if (sVar8 != 2000) goto LAB_00102023;
    pcStack_68 = (code *)0x101fb0;
    bitset_inplace_intersection(pbVar4,pbVar7);
    pcStack_68 = (code *)0x101fb8;
    sVar8 = bitset_count(pbVar4);
    if (sVar8 != 1000) goto LAB_00102028;
    pcStack_68 = (code *)0x101fcb;
    bitset_inplace_difference(pbVar4,pbVar7);
    pcStack_68 = (code *)0x101fd3;
    sVar8 = bitset_count(pbVar4);
    if (sVar8 != 0) goto LAB_0010202d;
    pcStack_68 = (code *)0x101fe3;
    bitset_inplace_union(pbVar4,pbVar7);
    pcStack_68 = (code *)0x101fee;
    bitset_inplace_difference(pbVar7,pbVar4);
    pcStack_68 = (code *)0x101ff6;
    sVar8 = bitset_count(pbVar7);
    if (sVar8 == 0) {
      pcStack_68 = (code *)0x102003;
      bitset_free(pbVar4);
      bitset_free(pbVar7);
      return;
    }
  }
  else {
    pcStack_68 = (code *)0x102019;
    test_union_intersection_cold_1();
LAB_00102019:
    pcStack_68 = (code *)0x10201e;
    test_union_intersection_cold_2();
LAB_0010201e:
    pcStack_68 = (code *)0x102023;
    test_union_intersection_cold_3();
LAB_00102023:
    pcStack_68 = (code *)0x102028;
    test_union_intersection_cold_4();
LAB_00102028:
    pcStack_68 = (code *)0x10202d;
    test_union_intersection_cold_5();
LAB_0010202d:
    pcStack_68 = (code *)0x102032;
    test_union_intersection_cold_6();
  }
  pcStack_68 = test_counts;
  test_union_intersection_cold_7();
  pcStack_a0 = (code *)0x102047;
  pbStack_90 = pbVar4;
  uStack_88 = uVar21;
  uStack_80 = uVar18;
  pbStack_78 = pbVar7;
  lStack_70 = lVar16;
  pcStack_68 = (code *)lVar11;
  pbVar4 = bitset_create();
  lVar16 = 0;
  pcStack_a0 = (code *)0x102052;
  pbVar7 = bitset_create();
  uVar18 = 0;
  uVar21 = 0;
  do {
    uVar12 = uVar21 >> 5;
    if (uVar12 < pbVar4->arraysize) {
LAB_00102078:
      pbVar4->array[uVar12] = pbVar4->array[uVar12] | 1L << ((byte)lVar16 & 0x3e);
    }
    else {
      pcStack_a0 = (code *)0x102074;
      _Var3 = bitset_grow(pbVar4,uVar12 + 1);
      if (_Var3) goto LAB_00102078;
    }
    uVar12 = uVar18 >> 6;
    if (uVar12 < pbVar7->arraysize) {
LAB_001020aa:
      pbVar7->array[uVar12] = pbVar7->array[uVar12] | 1L << ((byte)uVar18 & 0x3f);
    }
    else {
      pcStack_a0 = (code *)0x1020a6;
      _Var3 = bitset_grow(pbVar7,uVar12 + 1);
      if (_Var3) goto LAB_001020aa;
    }
    uVar21 = uVar21 + 1;
    uVar18 = uVar18 + 3;
    lVar16 = lVar16 + 2;
  } while (uVar21 != 1000);
  pcStack_a0 = (code *)0x1020db;
  sVar8 = bitset_intersection_count(pbVar4,pbVar7);
  if (sVar8 == 0x14e) {
    pcStack_a0 = (code *)0x1020ee;
    sVar8 = bitset_union_count(pbVar4,pbVar7);
    if (sVar8 == 0x682) {
      pcStack_a0 = (code *)0x1020fe;
      bitset_free(pbVar4);
      bitset_free(pbVar7);
      return;
    }
  }
  else {
    pcStack_a0 = (code *)0x102119;
    test_counts_cold_1();
  }
  pcStack_a0 = test_disjoint;
  test_counts_cold_2();
  pcStack_c8 = (code *)0x10212c;
  pbStack_c0 = pbVar4;
  lStack_b8 = lVar16;
  uStack_b0 = uVar21;
  pbStack_a8 = pbVar7;
  pcStack_a0 = (code *)uVar18;
  pbVar4 = bitset_create();
  uVar21 = 0;
  pcStack_c8 = (code *)0x102137;
  pbVar7 = bitset_create();
  do {
    uVar18 = uVar21 >> 6;
    if ((uVar21 & 1) == 0) {
      uVar12 = 0x3e;
      pbVar10 = pbVar4;
      if (uVar18 < pbVar4->arraysize) goto LAB_0010218d;
      pcStack_c8 = (code *)0x102175;
      _Var3 = bitset_grow(pbVar4,uVar18 + 1);
LAB_00102189:
      if (_Var3 != false) goto LAB_0010218d;
    }
    else {
      uVar12 = 0x3f;
      pbVar10 = pbVar7;
      if (pbVar7->arraysize <= uVar18) {
        pcStack_c8 = (code *)0x102186;
        _Var3 = bitset_grow(pbVar7,uVar18 + 1);
        goto LAB_00102189;
      }
LAB_0010218d:
      uVar20 = (uint)uVar12 & (uint)uVar21;
      uVar12 = (ulong)uVar20;
      pbVar10->array[uVar18] = pbVar10->array[uVar18] | 1L << (sbyte)uVar20;
    }
    uVar21 = uVar21 + 1;
  } while (uVar21 != 1000);
  pcStack_c8 = (code *)0x1021b9;
  _Var3 = bitsets_disjoint(pbVar4,pbVar7);
  if (_Var3) {
    uVar12 = 0x20000000000000;
    if (pbVar4->arraysize < 8) {
      pcStack_c8 = (code *)0x1021db;
      _Var3 = bitset_grow(pbVar4,8);
      if (_Var3) goto LAB_001021df;
    }
    else {
LAB_001021df:
      pbVar4->array[7] = pbVar4->array[7] | 0x20000000000000;
    }
    if (pbVar7->arraysize < 8) {
      pcStack_c8 = (code *)0x1021fa;
      _Var3 = bitset_grow(pbVar7,8);
      if (_Var3) goto LAB_001021fe;
    }
    else {
LAB_001021fe:
      pbVar7->array[7] = pbVar7->array[7] | 0x20000000000000;
    }
    pcStack_c8 = (code *)0x102210;
    _Var3 = bitsets_disjoint(pbVar4,pbVar7);
    if (!_Var3) {
      pcStack_c8 = (code *)0x10221c;
      bitset_free(pbVar4);
      bitset_free(pbVar7);
      return;
    }
  }
  else {
    pcStack_c8 = (code *)0x102232;
    test_disjoint_cold_1();
  }
  pcStack_c8 = test_intersects;
  test_disjoint_cold_2();
  pbStack_f0 = (bitset_t *)0x102245;
  pbStack_e8 = pbVar4;
  uStack_e0 = uVar21;
  uStack_d8 = uVar18;
  pbStack_d0 = pbVar7;
  pcStack_c8 = (code *)uVar12;
  pbVar4 = bitset_create();
  pbStack_f0 = (bitset_t *)0x10224d;
  pbVar7 = bitset_create();
  pbStack_f0 = (bitset_t *)0x102258;
  _Var3 = bitset_empty(pbVar4);
  if (_Var3) {
    uVar21 = 0;
    do {
      uVar18 = uVar21 >> 6;
      if ((uVar21 & 1) == 0) {
        uVar12 = 0x3e;
        pbVar10 = pbVar4;
        if (uVar18 < pbVar4->arraysize) goto LAB_001022b6;
        pbStack_f0 = (bitset_t *)0x10229e;
        _Var3 = bitset_grow(pbVar4,uVar18 + 1);
LAB_001022b2:
        if (_Var3 != false) goto LAB_001022b6;
      }
      else {
        uVar12 = 0x3f;
        pbVar10 = pbVar7;
        if (pbVar7->arraysize <= uVar18) {
          pbStack_f0 = (bitset_t *)0x1022af;
          _Var3 = bitset_grow(pbVar7,uVar18 + 1);
          goto LAB_001022b2;
        }
LAB_001022b6:
        uVar20 = (uint)uVar12 & (uint)uVar21;
        uVar12 = (ulong)uVar20;
        pbVar10->array[uVar18] = pbVar10->array[uVar18] | 1L << (sbyte)uVar20;
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != 1000);
    pbStack_f0 = (bitset_t *)0x1022e2;
    _Var3 = bitsets_intersect(pbVar4,pbVar7);
    if (_Var3) goto LAB_0010235b;
    uVar12 = 0x20000000000;
    if (pbVar4->arraysize < 0x10) {
      pbStack_f0 = (bitset_t *)0x102304;
      _Var3 = bitset_grow(pbVar4,0x10);
      if (_Var3) goto LAB_00102308;
    }
    else {
LAB_00102308:
      pbVar4->array[0xf] = pbVar4->array[0xf] | 0x20000000000;
    }
    if (pbVar7->arraysize < 0x10) {
      pbStack_f0 = (bitset_t *)0x102323;
      _Var3 = bitset_grow(pbVar7,0x10);
      if (_Var3) goto LAB_00102327;
    }
    else {
LAB_00102327:
      pbVar7->array[0xf] = pbVar7->array[0xf] | 0x20000000000;
    }
    pbStack_f0 = (bitset_t *)0x102339;
    _Var3 = bitsets_intersect(pbVar4,pbVar7);
    if (_Var3) {
      pbStack_f0 = (bitset_t *)0x102345;
      bitset_free(pbVar4);
      bitset_free(pbVar7);
      return;
    }
  }
  else {
    pbStack_f0 = (bitset_t *)0x10235b;
    test_intersects_cold_1();
LAB_0010235b:
    pbStack_f0 = (bitset_t *)0x102360;
    test_intersects_cold_3();
  }
  pbStack_f0 = (bitset_t *)test_contains_all_different_sizes;
  test_intersects_cold_2();
  pcStack_108 = (code *)0x102373;
  pbStack_f8 = pbVar4;
  pbStack_f0 = pbVar7;
  pbVar4 = bitset_create_with_capacity(10);
  pcStack_108 = (code *)0x102380;
  pbVar7 = bitset_create_with_capacity(5);
  if (pbVar4->arraysize == 0) {
    pcStack_108 = (code *)0x102397;
    _Var3 = bitset_grow(pbVar4,1);
    if (_Var3) goto LAB_0010239b;
  }
  else {
LAB_0010239b:
    *pbVar4->array = *pbVar4->array | 2;
  }
  if (pbVar4->arraysize == 0) {
    pcStack_108 = (code *)0x1023b6;
    _Var3 = bitset_grow(pbVar4,1);
    if (_Var3) goto LAB_001023ba;
  }
  else {
LAB_001023ba:
    *pbVar4->array = *pbVar4->array | 0x10;
  }
  if (pbVar4->arraysize == 0) {
    pcStack_108 = (code *)0x1023d5;
    _Var3 = bitset_grow(pbVar4,1);
    if (_Var3) goto LAB_001023d9;
  }
  else {
LAB_001023d9:
    *pbVar4->array = *pbVar4->array | 0x40;
  }
  if (pbVar7->arraysize == 0) {
    pcStack_108 = (code *)0x1023f4;
    _Var3 = bitset_grow(pbVar7,1);
    if (_Var3) goto LAB_001023f8;
  }
  else {
LAB_001023f8:
    *pbVar7->array = *pbVar7->array | 2;
  }
  if (pbVar7->arraysize == 0) {
    pcStack_108 = (code *)0x102413;
    _Var3 = bitset_grow(pbVar7,1);
    if (_Var3) goto LAB_00102417;
  }
  else {
LAB_00102417:
    *pbVar7->array = *pbVar7->array | 0x10;
  }
  pcStack_108 = (code *)0x102429;
  _Var3 = bitset_contains_all(pbVar4,pbVar7);
  if (_Var3) {
    pcStack_108 = (code *)0x102438;
    _Var3 = bitset_contains_all(pbVar7,pbVar4);
    if (!_Var3) {
      pcStack_108 = (code *)0x102444;
      bitset_free(pbVar4);
      bitset_free(pbVar7);
      return;
    }
  }
  else {
    pcStack_108 = (code *)0x102458;
    test_contains_all_different_sizes_cold_1();
  }
  pcStack_108 = test_contains_all;
  test_contains_all_different_sizes_cold_2();
  pcStack_130 = (code *)0x10246a;
  pbStack_120 = pbVar4;
  uStack_118 = 1000;
  pbStack_110 = pbVar7;
  pcStack_108 = (code *)uVar12;
  pbVar4 = bitset_create();
  uVar21 = 0;
  pcStack_130 = (code *)0x102475;
  pbVar7 = bitset_create();
  do {
    uVar18 = uVar21 >> 6;
    if (uVar18 < pbVar4->arraysize) {
LAB_00102496:
      pbVar4->array[uVar18] = pbVar4->array[uVar18] | 1L << ((byte)uVar21 & 0x3f);
    }
    else {
      pcStack_130 = (code *)0x102492;
      _Var3 = bitset_grow(pbVar4,uVar18 + 1);
      if (_Var3) goto LAB_00102496;
    }
    if ((uVar21 & 1) == 0) {
      if (pbVar7->arraysize <= uVar18) {
        pcStack_130 = (code *)0x1024c1;
        _Var3 = bitset_grow(pbVar7,uVar18 + 1);
        if (!_Var3) goto LAB_001024da;
      }
      pbVar7->array[uVar18] = pbVar7->array[uVar18] | 1L << ((byte)uVar21 & 0x3e);
    }
LAB_001024da:
    uVar21 = uVar21 + 1;
  } while (uVar21 != 1000);
  pcStack_130 = (code *)0x1024f1;
  _Var3 = bitset_contains_all(pbVar4,pbVar7);
  if (_Var3) {
    pcStack_130 = (code *)0x102500;
    _Var3 = bitset_contains_all(pbVar7,pbVar4);
    if (_Var3) goto LAB_0010256b;
    if (pbVar7->arraysize < 0x10) {
      pcStack_130 = (code *)0x102518;
      _Var3 = bitset_grow(pbVar7,0x10);
      if (_Var3) goto LAB_0010251c;
    }
    else {
LAB_0010251c:
      pbVar7->array[0xf] = pbVar7->array[0xf] | 0x20000000000;
    }
    pcStack_130 = (code *)0x102538;
    _Var3 = bitset_contains_all(pbVar4,pbVar7);
    if (!_Var3) {
      pcStack_130 = (code *)0x102547;
      _Var3 = bitset_contains_all(pbVar7,pbVar4);
      if (!_Var3) {
        pcStack_130 = (code *)0x102553;
        bitset_free(pbVar4);
        bitset_free(pbVar7);
        return;
      }
      goto LAB_00102575;
    }
  }
  else {
    pcStack_130 = (code *)0x10256b;
    test_contains_all_cold_1();
LAB_0010256b:
    pcStack_130 = (code *)0x102570;
    test_contains_all_cold_4();
  }
  pcStack_130 = (code *)0x102575;
  test_contains_all_cold_3();
LAB_00102575:
  pcStack_130 = test_next_bits_iterate;
  test_contains_all_cold_2();
  uVar18 = 0;
  pbStack_140 = pbVar4;
  pbStack_138 = pbVar7;
  pcStack_130 = (code *)uVar21;
  pbVar4 = bitset_create();
  do {
    uVar21 = uVar18 >> 6;
    if (uVar21 < pbVar4->arraysize) {
LAB_001025ab:
      pbVar4->array[uVar21] = pbVar4->array[uVar21] | 1L << ((byte)uVar18 & 0x3f);
    }
    else {
      _Var3 = bitset_grow(pbVar4,uVar21 + 1);
      if (_Var3) goto LAB_001025ab;
    }
    uVar18 = uVar18 + 1;
  } while (uVar18 != 100);
  uVar21 = 0x3e6;
  do {
    uVar21 = uVar21 + 2;
    uVar18 = uVar21 >> 6;
    if (uVar18 < pbVar4->arraysize) {
LAB_001025ed:
      pbVar4->array[uVar18] = pbVar4->array[uVar18] | 1L << ((byte)uVar21 & 0x3e);
    }
    else {
      _Var3 = bitset_grow(pbVar4,uVar18 + 1);
      if (_Var3) goto LAB_001025ed;
    }
  } while (uVar21 < 0x44a);
  uVar21 = pbVar4->arraysize;
  uVar18 = 0;
  lVar16 = 0;
LAB_0010261a:
  uVar12 = uVar18 >> 6;
  if (uVar12 < uVar21) {
    puVar1 = pbVar4->array;
    uVar15 = (puVar1[uVar12] >> ((byte)uVar18 & 0x3f)) << ((byte)uVar18 & 0x3f);
    uVar14 = uVar18 & 0xffffffffffffffc0;
    uVar13 = 0;
    do {
      while (uVar15 == 0) {
        uVar12 = uVar12 + 1;
        if (uVar12 == uVar21) goto LAB_0010268b;
        uVar14 = uVar14 + 0x40;
        uVar15 = puVar1[uVar12];
        if (2 < uVar13) goto LAB_0010268b;
      }
      uVar19 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
        }
      }
      auStack_160[uVar13] = uVar19 | uVar14;
      uVar19 = uVar15 - 1;
      if (uVar13 == 2) {
        uVar19 = 0xffffffffffffffff;
      }
      uVar13 = uVar13 + 1;
      uVar15 = uVar15 & uVar19;
    } while (uVar13 != 3);
    uVar13 = 3;
LAB_0010268b:
    if (uVar13 != 0) {
      uVar18 = auStack_160[uVar13 - 1];
    }
  }
  else {
    uVar13 = 0;
  }
  if (uVar13 != 0) {
    uVar12 = lVar16 * 2 + 800;
    uVar14 = 0;
    do {
      uVar19 = lVar16 + uVar14;
      if (99 < lVar16 + uVar14) {
        uVar19 = uVar12;
      }
      if (auStack_160[uVar14] != uVar19) {
        test_next_bits_iterate_cold_1();
        goto LAB_001026f4;
      }
      uVar14 = uVar14 + 1;
      uVar12 = uVar12 + 2;
    } while (uVar13 != uVar14);
    uVar18 = uVar18 + 1;
    lVar16 = uVar13 + lVar16;
    goto LAB_0010261a;
  }
  if (lVar16 == 0x96) {
    bitset_free(pbVar4);
    return;
  }
LAB_001026f4:
  test_next_bits_iterate_cold_2();
  uVar21 = 0;
  pbVar4 = bitset_create();
  do {
    uVar18 = uVar21 >> 6;
    if ((uVar18 < pbVar4->arraysize) || (_Var3 = bitset_grow(pbVar4,uVar18 + 1), _Var3)) {
      pbVar4->array[uVar18] = pbVar4->array[uVar18] | 1L << ((byte)uVar21 & 0x3f);
    }
    uVar21 = uVar21 + 1;
  } while (uVar21 != 100);
  uVar21 = 0x3e6;
  do {
    uVar21 = uVar21 + 2;
    uVar18 = uVar21 >> 6;
    if ((uVar18 < pbVar4->arraysize) || (_Var3 = bitset_grow(pbVar4,uVar18 + 1), _Var3)) {
      pbVar4->array[uVar18] = pbVar4->array[uVar18] | 1L << ((byte)uVar21 & 0x3e);
    }
  } while (uVar21 < 0x44a);
  uVar21 = 0;
  uVar18 = 0;
  do {
    uVar12 = uVar21 >> 6;
    if (uVar12 < pbVar4->arraysize) {
      uVar13 = pbVar4->array[uVar12] >> ((byte)uVar21 & 0x3f);
      if (uVar13 == 0) {
        lVar16 = uVar12 * -0x40;
        do {
          uVar12 = uVar12 + 1;
          if (pbVar4->arraysize == uVar12) goto LAB_001027e0;
          uVar13 = pbVar4->array[uVar12];
          lVar16 = lVar16 + -0x40;
        } while (uVar13 == 0);
        lVar17 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
          }
        }
        uVar21 = lVar17 - lVar16;
      }
      else {
        lVar16 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
          }
        }
        uVar21 = uVar21 + lVar16;
      }
      bVar2 = true;
    }
    else {
LAB_001027e0:
      bVar2 = false;
    }
    if (!bVar2) {
      if (uVar18 == 0x96) {
        bitset_free(pbVar4);
        return;
      }
      goto LAB_00102822;
    }
    uVar12 = uVar18 * 2 + 800;
    if (uVar18 < 100) {
      uVar12 = uVar18;
    }
    if (uVar21 != uVar12) {
      test_next_bit_iterate_cold_2();
LAB_00102822:
      test_next_bit_iterate_cold_1();
      test_next_bit_iterate();
      test_next_bits_iterate();
      test_set_to_val();
      test_construct();
      test_union_intersection();
      test_iterate();
      test_iterate2();
      test_max_min();
      test_counts();
      test_shift_right();
      test_shift_left();
      test_disjoint();
      test_intersects();
      test_contains_all();
      test_contains_all_different_sizes();
      puts("All TEST_ASSERTs passed. Code is probably ok.");
      return;
    }
    uVar18 = uVar18 + 1;
    uVar21 = uVar21 + 1;
  } while( true );
}

Assistant:

void test_shift_right() {
  for (size_t sh = 0; sh < 256; sh++) {
    bitset_t *b = bitset_create();
    int power = 3;
    size_t s1 = 100 + sh;
    size_t s2 = s1 + 5000;
    for (size_t k = s1; k < s2; ++k) {
      bitset_set(b, power * k);
    }
    size_t mycount = bitset_count(b);
    bitset_shift_right(b, sh);
    TEST_ASSERT(bitset_count(b) == mycount);
    for (size_t k = s1; k < s2; ++k) {
      TEST_ASSERT(bitset_get(b, power * k - sh));
    }
    bitset_free(b);
  }
}